

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *
make_delim_long<char8_t,std::__cxx11::u8string>
          (basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>
           *__return_storage_ptr__,size_t length,char8_t in_delim)

{
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_50;
  undefined1 local_1a;
  char8_t local_19;
  size_t sStack_18;
  char8_t in_delim_local;
  size_t length_local;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> *result;
  
  local_1a = 0;
  local_19 = in_delim;
  sStack_18 = length;
  length_local = (size_t)__return_storage_ptr__;
  std::__cxx11::u8string::u8string((u8string *)__return_storage_ptr__);
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
  operator+=(__return_storage_ptr__,local_19);
  make_word<char8_t,std::__cxx11::u8string>(&local_50,sStack_18,local_19);
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
  operator+=(__return_storage_ptr__,&local_50);
  std::__cxx11::u8string::~u8string((u8string *)&local_50);
  std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>::
  operator+=(__return_storage_ptr__,local_19);
  return __return_storage_ptr__;
}

Assistant:

ResultT make_delim_long(size_t length = 8, T in_delim = default_delim<T>) {
	// in this context, in_delim should be whatever was previously passed to make_word
	// doing so will ensure the value returned by this method is distinctly different from others
	ResultT result;
	result += in_delim;
	result += make_word<T>(length, in_delim);
	result += in_delim;
	return result;
}